

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_logging.cc
# Opt level: O3

bool __thiscall tcmalloc::Logger::Add(Logger *this,LogItem *item)

{
  char *__s;
  bool bVar1;
  size_t sVar2;
  int base;
  uint64_t num;
  char *__dest;
  
  __dest = this->p_;
  if (__dest < this->end_) {
    *__dest = ' ';
    __dest = this->p_ + 1;
    this->p_ = __dest;
  }
  switch(item->tag_) {
  case kStr:
    __s = (item->u_).str;
    sVar2 = strlen(__s);
    sVar2 = (size_t)(int)sVar2;
    if ((long)this->end_ - (long)__dest < (long)sVar2) {
      return false;
    }
    memcpy(__dest,__s,sVar2);
    this->p_ = this->p_ + sVar2;
    return true;
  case kSigned:
    num = (item->u_).unum;
    if ((long)num < 0) {
      if (this->end_ == __dest || (long)this->end_ - (long)__dest < 0) {
        return false;
      }
      *__dest = '-';
      this->p_ = this->p_ + 1;
      num = -(item->u_).snum;
    }
    break;
  case kUnsigned:
    num = (item->u_).unum;
    break;
  case kPtr:
    if ((long)this->end_ - (long)__dest < 2) {
      return false;
    }
    __dest[0] = '0';
    __dest[1] = 'x';
    this->p_ = this->p_ + 2;
    num = (item->u_).unum;
    base = 0x10;
    goto LAB_00112d4b;
  default:
    return false;
  }
  base = 10;
LAB_00112d4b:
  bVar1 = AddNum(this,num,base);
  return bVar1;
}

Assistant:

bool Logger::Add(const LogItem& item) {
  // Separate items with spaces
  if (p_ < end_) {
    *p_ = ' ';
    p_++;
  }

  switch (item.tag_) {
    case LogItem::kStr:
      return AddStr(item.u_.str, strlen(item.u_.str));
    case LogItem::kUnsigned:
      return AddNum(item.u_.unum, 10);
    case LogItem::kSigned:
      if (item.u_.snum < 0) {
        // The cast to uint64_t is intentionally before the negation
        // so that we do not attempt to negate -2^63.
        return AddStr("-", 1)
            && AddNum(- static_cast<uint64_t>(item.u_.snum), 10);
      } else {
        return AddNum(static_cast<uint64_t>(item.u_.snum), 10);
      }
    case LogItem::kPtr:
      return AddStr("0x", 2)
          && AddNum(reinterpret_cast<uintptr_t>(item.u_.ptr), 16);
    default:
      return false;
  }
}